

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t main(wchar_t argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  __mode_t __mask;
  wchar_t wVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  byte *__dest;
  char *pcVar10;
  byte *pbVar11;
  tm *__tp;
  size_t sVar12;
  char *pcVar13;
  long *__s;
  ulong uVar14;
  int iVar15;
  wchar_t wVar16;
  long lVar17;
  int iVar18;
  wchar_t wVar19;
  char *pcVar20;
  char cVar21;
  byte *pbVar22;
  char cVar23;
  byte *pbVar24;
  char *pcVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  char *pcVar29;
  int iVar30;
  char **ppcVar31;
  ulong uVar32;
  ulong uVar33;
  int *piVar34;
  bool bVar35;
  char *local_3210;
  uint local_3204;
  char *local_3200;
  byte *local_31c8;
  char **local_31b8;
  time_t now;
  char tmpdir_timestamp [32];
  char local_3178 [64];
  wchar_t test_set [49];
  tm tmbuf;
  char tmpdir [4096];
  sigaction sa;
  
  pcVar6 = getcwd((char *)0x0,0);
  while (sVar7 = strlen(pcVar6), pcVar6[sVar7 - 1] == '\n') {
    pcVar6[sVar7 - 1] = '\0';
  }
  pcVar20 = *argv;
  sVar7 = strlen(pcVar20);
  local_3200 = (char *)malloc(sVar7 + 1);
  if (local_3200 == (char *)0x0) {
LAB_00106195:
    pcVar6 = "ERROR: Out of memory.";
    sVar7 = 0x15;
  }
  else {
    strncpy(local_3200,pcVar20,sVar7 + 1);
    iVar15 = 0;
    iVar30 = 0;
    pcVar10 = pcVar20;
    while( true ) {
      pcVar8 = pcVar10 + 1;
      cVar23 = *pcVar10;
      pcVar10 = pcVar8;
      iVar18 = iVar15;
      if (((cVar23 != '/') && (cVar23 != '\\')) &&
         (pcVar10 = pcVar20, iVar18 = iVar30, cVar23 == '\0')) break;
      iVar15 = iVar15 + 1;
      pcVar20 = pcVar10;
      iVar30 = iVar18;
      pcVar10 = pcVar8;
    }
    local_3200[iVar30] = '\0';
    if (*local_3200 != '/') {
      sVar7 = strlen(pcVar6);
      sVar9 = strlen(local_3200);
      local_3200 = (char *)realloc(local_3200,sVar7 + sVar9 + 2);
      if (local_3200 == (char *)0x0) goto LAB_00106195;
      sVar7 = strlen(pcVar6);
      sVar9 = strlen(local_3200);
      memmove(local_3200 + sVar7 + 1,local_3200,sVar9 + 1);
      memcpy(local_3200,pcVar6,sVar7);
      local_3200[sVar7] = '/';
    }
    __dest = (byte *)getenv("BSDCPIO");
    testprogfile = (char *)__dest;
    local_3210 = getenv("TMPDIR");
    if (((local_3210 == (char *)0x0) && (local_3210 = getenv("TMP"), local_3210 == (char *)0x0)) &&
       (local_3210 = getenv("TEMP"), local_3210 == (char *)0x0)) {
      pcVar10 = getenv("TEMPDIR");
      local_3210 = "/tmp";
      if (pcVar10 != (char *)0x0) {
        local_3210 = pcVar10;
      }
    }
    sVar7 = strlen(local_3210);
    lVar26 = 0xffa - sVar7;
    do {
      lVar17 = lVar26;
      sVar9 = sVar7;
      if (sVar9 == 0) break;
      sVar7 = sVar9 - 1;
      lVar26 = lVar17 + 1;
    } while (local_3210[sVar9 - 1] == '/');
    pcVar10 = getenv("BSDCPIO_DEBUG");
    if (pcVar10 != (char *)0x0) {
      dump_on_failure = 1;
    }
    pcVar10 = getenv("_VERBOSITY_LEVEL");
    if (pcVar10 == (char *)0x0) {
      bVar35 = true;
    }
    else {
      wVar3 = atoi(pcVar10);
      bVar35 = (uint)(wVar3 + L'\xfffffffd') < 0xfffffffc;
      verbosity = L'\0';
      if (!bVar35) {
        verbosity = wVar3;
      }
    }
    wVar3 = verbosity;
    pbVar11 = (byte *)getenv("BSDCPIO_TEST_FILES");
    ppcVar31 = argv + 1;
    wVar19 = until_failure;
    refdir = (char *)pbVar11;
    while ((pcVar10 = *ppcVar31, pcVar10 != (char *)0x0 && (*pcVar10 == '-'))) {
      ppcVar31 = ppcVar31 + 1;
      pbVar22 = (byte *)(pcVar10 + 1);
      while( true ) {
        bVar1 = *pbVar22;
        uVar32 = (ulong)bVar1;
        if (bVar1 == 0) break;
        pbVar22 = pbVar22 + 1;
        if ((bVar1 & 0xfd) == 0x70) {
          pbVar24 = pbVar22;
          if (*pbVar22 != 0) {
LAB_00105247:
            pbVar22 = (byte *)0x110a76;
            goto LAB_0010524a;
          }
          pbVar24 = (byte *)*ppcVar31;
          if (pbVar24 != (byte *)0x0) {
            ppcVar31 = ppcVar31 + 1;
            goto LAB_00105247;
          }
          pcVar6 = "Option -%c requires argument.\n";
LAB_001060ef:
          fprintf(_stderr,pcVar6,uVar32);
          goto LAB_001060f6;
        }
        pbVar24 = (byte *)0x0;
LAB_0010524a:
        switch(bVar1) {
        case 100:
          dump_on_failure = 1;
          break;
        default:
          uVar32 = (ulong)(uint)(int)(char)bVar1;
          pcVar6 = "Unrecognized option \'%c\'\n";
          goto LAB_001060ef;
        case 0x6b:
          keep_temp_files = 1;
          break;
        case 0x70:
          __dest = pbVar24;
          testprogfile = (char *)pbVar24;
          break;
        case 0x71:
          if (bVar35) {
            wVar3 = wVar3 + L'\xffffffff';
            verbosity = wVar3;
          }
          break;
        case 0x72:
          pbVar11 = pbVar24;
          refdir = (char *)pbVar24;
          break;
        case 0x73:
          fail_if_tests_skipped = 1;
          break;
        case 0x75:
          wVar19 = wVar19 + L'\x01';
          until_failure = wVar19;
          break;
        case 0x76:
          if (bVar35) {
            wVar3 = wVar3 + L'\x01';
            verbosity = wVar3;
          }
        }
      }
    }
    if (__dest == (byte *)0x0) {
      sVar7 = strlen(local_3200);
      sVar7 = sVar7 + 9;
      __dest = (byte *)malloc(sVar7);
      if (__dest == (byte *)0x0) goto LAB_00106195;
      strncpy((char *)__dest,local_3200,sVar7);
      strncat((char *)__dest,"/",sVar7);
      strncat((char *)__dest,"bsdcpio",sVar7);
      testprogfile = (char *)__dest;
      local_31c8 = __dest;
    }
    else {
      local_31c8 = (byte *)0x0;
    }
    sVar7 = strlen((char *)__dest);
    sVar7 = sVar7 + 3;
    pcVar10 = (char *)malloc(sVar7);
    strncpy(pcVar10,"\"",sVar7);
    strncat(pcVar10,(char *)__dest,sVar7);
    strncat(pcVar10,"\"",sVar7);
    testprog = pcVar10;
    if ((pbVar11 == (byte *)0x0) || (*pbVar11 == 0x2f)) {
      sa.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
      sigemptyset((sigset_t *)&sa.sa_mask);
      sa.sa_flags = L'\0';
      sigaction(0xd,(sigaction *)&sa,(sigaction *)0x0);
      now = time((time_t *)0x0);
      uVar32 = 0;
      do {
        __tp = localtime_r(&now,(tm *)&tmbuf);
        strftime(tmpdir_timestamp,0x20,"%Y-%m-%dT%H.%M.%S",__tp);
        sVar7 = strlen(pcVar20);
        sVar12 = strlen(tmpdir_timestamp);
        if ((sVar7 - lVar17) + sVar12 < 0xfffffffffffff000) {
          pcVar6 = "ERROR: Temp directory pathname too long\n";
          sVar7 = 0x28;
          goto LAB_0010614e;
        }
        snprintf(tmpdir,0x1000,"%.*s/%s.%s-%03d",sVar9,local_3210,pcVar20,tmpdir_timestamp,uVar32);
        wVar3 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                   ,L'ၛ',tmpdir,L'ǭ');
        pcVar10 = refdir;
        if (wVar3 != L'\0') {
          pcVar8 = (char *)calloc(0x1000,1);
          if ((pcVar8 == (char *)0x0) ||
             (pcVar13 = (char *)calloc(0x2000,1), pcVar13 == (char *)0x0)) {
            pcVar6 = "Unable to allocate memory\n";
            sVar7 = 0x1a;
            goto LAB_0010614e;
          }
          if (pcVar10 != (char *)0x0) {
            __s = (long *)0x0;
            snprintf(pcVar8,0x1000,"%s",pcVar10);
            pcVar10 = slurpfile((size_t *)0x0,"%s/%s",pcVar8,"test_option_f.cpio.uu");
            if (pcVar10 != (char *)0x0) goto LAB_0010588b;
            sVar7 = strlen(pcVar13);
            goto LAB_00105551;
          }
          __s = (long *)getcwd((char *)0x0,0);
          while (sVar7 = strlen((char *)__s), *(char *)((long)__s + (sVar7 - 1)) == '\n') {
            *(undefined1 *)((long)__s + (sVar7 - 1)) = 0;
          }
          snprintf(pcVar8,0x1000,"%s",__s);
          pcVar10 = slurpfile((size_t *)0x0,"%s/%s",pcVar8,"test_option_f.cpio.uu");
          if (pcVar10 != (char *)0x0) {
LAB_0010588b:
            free(pcVar10);
            free(__s);
            free(pcVar13);
            pcVar10 = strdup(pcVar8);
            free(pcVar8);
            refdir = pcVar10;
            putchar(10);
            puts("If tests fail or crash, details will be in:");
            printf("   %s\n",tmpdir);
            putchar(10);
            if (verbosity < L'\0') {
              printf("Running ");
              fflush(_stdout);
            }
            else {
              printf("Reference files will be read from: %s\n",refdir);
              printf("Running tests on: %s\n",testprog);
              printf("Exercising: ");
              fflush(_stdout);
              systemf("%s --version",testprog);
              putchar(10);
            }
            local_3204 = 0;
            uVar27 = 0;
            do {
              pcVar8 = *ppcVar31;
              local_31b8 = ppcVar31;
              uVar28 = uVar27;
              do {
                if (pcVar8 != (char *)0x0) {
                  cVar23 = *pcVar8;
                  if (9 < (byte)(cVar23 - 0x30U)) {
                    lVar26 = 0;
                    uVar32 = 0;
LAB_00105a1d:
                    if (lVar26 != 0x31) {
                      pcVar13 = tests[lVar26].name;
                      pcVar25 = pcVar8 + (cVar23 == '^');
                      do {
                        cVar21 = *pcVar25;
                        if (cVar21 != '\\') {
                          if (cVar21 != '*') goto LAB_00105a86;
                          while (pcVar29 = pcVar25 + 1, cVar21 == '*') {
                            pcVar25 = pcVar29;
                            cVar21 = *pcVar29;
                          }
                          if (cVar21 == '\\') {
                            cVar21 = *pcVar29;
                            pcVar25 = pcVar29;
                          }
                          pcVar13 = strchr(pcVar13,(int)cVar21);
                          if (pcVar13 != (char *)0x0) goto LAB_00105a86;
LAB_00105a98:
                          bVar2 = false;
                          bVar35 = true;
                          goto LAB_00105aa4;
                        }
                        cVar21 = pcVar25[1];
                        pcVar25 = pcVar25 + 1;
LAB_00105a86:
                        if (cVar21 != *pcVar13) goto LAB_00105a98;
                        if (cVar21 == '\0') goto LAB_00105a9f;
                        pcVar25 = pcVar25 + 1;
                        pcVar13 = pcVar13 + 1;
                      } while( true );
                    }
                    goto LAB_00105b17;
                  }
                  pcVar13 = pcVar8 + 2;
                  wVar3 = L'\0';
                  pcVar25 = pcVar8;
                  while( true ) {
                    pcVar25 = pcVar25 + 1;
                    if (9 < (byte)(cVar23 - 0x30U)) break;
                    wVar3 = (uint)(byte)(cVar23 - 0x30U) + wVar3 * 10;
                    cVar23 = *pcVar25;
                    pcVar13 = pcVar13 + 1;
                  }
                  wVar19 = wVar3;
                  if (cVar23 == '\0') {
LAB_00105ec9:
                    if (((L'\xffffffff' < wVar3) && (wVar19 < L'1')) && (wVar3 <= wVar19)) {
                      for (uVar32 = 0; wVar16 = wVar3 + (int)uVar32, wVar16 <= wVar19;
                          uVar32 = uVar32 + 1) {
                        test_set[uVar32] = wVar16;
                      }
LAB_00105b17:
                      if (0 < (int)uVar32) goto LAB_00105b20;
                    }
                  }
                  else if (cVar23 == '-') {
                    cVar23 = *pcVar25;
                    wVar19 = L'0';
                    if (cVar23 != '\0') {
                      wVar19 = L'\0';
                      while ((byte)(cVar23 - 0x30U) < 10) {
                        wVar19 = (uint)(byte)(cVar23 - 0x30U) + wVar19 * 10;
                        cVar23 = *pcVar13;
                        pcVar13 = pcVar13 + 1;
                      }
                    }
                    goto LAB_00105ec9;
                  }
                  printf("*** INVALID Test %s\n",pcVar8);
                  free(pcVar10);
                  free(local_3200);
LAB_001060f6:
                  usage(pcVar20);
LAB_00106100:
                  pcVar6 = "ERROR: Can\'t chdir to top work dir %s\n";
                  goto LAB_00106124;
                }
                for (lVar26 = 0; lVar26 != 0x31; lVar26 = lVar26 + 1) {
                  test_set[lVar26] = (wchar_t)lVar26;
                }
                uVar32 = 0x31;
LAB_00105b20:
                uVar27 = (int)uVar32 + uVar28;
                for (uVar14 = 0; wVar19 = skips, wVar3 = failures, uVar14 != (uVar32 & 0xffffffff);
                    uVar14 = uVar14 + 1) {
                  wVar16 = test_set[uVar14];
                  if (verbosity != L'\xffffffff') {
                    if (verbosity == L'\0') {
                      printf("%3d: %-64s",(ulong)(uint)wVar16,tests[wVar16].name);
                      fflush(_stdout);
                    }
                    else {
                      printf("%3d: %s\n",(ulong)(uint)wVar16,tests[wVar16].name);
                    }
                  }
                  wVar4 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                          ,L'ก',tmpdir);
                  if (wVar4 == L'\0') goto LAB_00106100;
                  snprintf(local_3178,0x40,"%s.log",tests[wVar16].name);
                  logfile = (FILE *)fopen(local_3178,"w");
                  fprintf((FILE *)logfile,"%s\n\n",tests[wVar16].name);
                  snprintf((char *)&sa,0x2000,"%s/%s",tmpdir,tests[wVar16].name);
                  testworkdir = (char *)&sa;
                  wVar4 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                             ,L'ญ',(char *)&sa,L'ǭ');
                  if ((wVar4 == L'\0') ||
                     (wVar4 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                              ,L'ฎ',testworkdir), wVar4 == L'\0')) {
                    pcVar6 = "ERROR: Can\'t chdir to work dir %s\n";
                    pcVar20 = testworkdir;
                    goto LAB_0010612c;
                  }
                  setlocale(6,"C");
                  __mask = umask(0);
                  umask(__mask);
                  (*tests[wVar16].func)();
                  testworkdir = (char *)0x0;
                  umask(__mask);
                  setlocale(6,"C");
                  wVar5 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                          ,L'ฤ',tmpdir);
                  wVar4 = failures;
                  if (wVar5 == L'\0') {
                    pcVar6 = "ERROR: Couldn\'t chdir to temp dir %s\n";
                    goto LAB_00106124;
                  }
                  tests[wVar16].failures = failures - wVar3;
                  if (verbosity == L'\0') {
                    pcVar8 = "skipped\n";
                    if (skips == wVar19) {
                      pcVar8 = "ok\n";
                    }
                    if (wVar4 != wVar3) {
                      pcVar8 = "FAIL\n";
                    }
                    printf(pcVar8);
                  }
                  else if (verbosity == L'\xffffffff') {
                    pcVar8 = "E";
                    if (wVar4 == wVar3) {
                      pcVar8 = ".";
                    }
                    printf(pcVar8);
                    fflush(_stdout);
                  }
                  uVar28 = uVar28 + 1;
                  log_console = (wchar_t)(verbosity == L'\x01');
                  for (uVar33 = 0; uVar33 != 10000; uVar33 = uVar33 + 1) {
                    if ((1 < failed_lines[uVar33].count) && (failed_lines[uVar33].skip == 0)) {
                      logprintf("%s:%u: Summary: Failed %d times\n",failed_filename,
                                uVar33 & 0xffffffff);
                    }
                  }
                  failed_filename = (char *)0x0;
                  memset(failed_lines,0,80000);
                  fclose((FILE *)logfile);
                  logfile = (FILE *)0x0;
                  iVar30 = tests[wVar16].failures;
                  if ((iVar30 == 0) && ((keep_temp_files & 1) == 0)) {
                    wVar3 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                            ,L'ั',tmpdir);
                    if (wVar3 != L'\0') {
                      systemf("rm -rf %s",tests[wVar16].name);
                      systemf("rm %s",local_3178);
                    }
                    iVar30 = tests[wVar16].failures;
                  }
                  if ((iVar30 != 0) && (local_3204 = local_3204 + 1, until_failure != L'\0'))
                  goto LAB_00105f12;
                }
                local_31b8 = local_31b8 + (*local_31b8 != (char *)0x0);
                pcVar8 = *local_31b8;
                uVar28 = uVar27;
              } while (pcVar8 != (char *)0x0);
              if (until_failure == L'\0') {
LAB_00105f12:
                free(local_31c8);
                free(local_3200);
                free(pcVar6);
                if (L'\xffffffff' < verbosity) {
                  putchar(10);
                  puts("Totals:");
                  printf("  Tests run:         %8d\n",(ulong)uVar28);
                  printf("  Tests failed:      %8d\n",(ulong)local_3204);
                  printf("  Assertions checked:%8d\n",(ulong)(uint)assertions);
                  printf("  Assertions failed: %8d\n",(ulong)(uint)failures);
                  printf("  Skips reported:    %8d\n",(ulong)(uint)skips);
                }
                if (failures == L'\0') {
                  if (verbosity == L'\xffffffff') {
                    putchar(10);
                  }
                  printf("%d tests passed, no failures\n",(ulong)uVar28);
                }
                else {
                  putchar(10);
                  puts("Failing tests:");
                  piVar34 = &tests[0].failures;
                  for (uVar32 = 0; uVar32 != 0x31; uVar32 = uVar32 + 1) {
                    if (*piVar34 != 0) {
                      printf("  %d: %s (%d failures)\n",uVar32 & 0xffffffff,*(char **)(piVar34 + -2)
                            );
                    }
                    piVar34 = piVar34 + 6;
                  }
                  putchar(10);
                  printf("Details for failing tests: %s\n",tmpdir);
                  putchar(10);
                }
                free(pcVar10);
                assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/test_utils/test_main.c"
                                ,L'Ⴤ',"..");
                rmdir(tmpdir);
                if (local_3204 == 0) {
                  wVar3 = (uint)(L'\0' < skips & fail_if_tests_skipped) * 2;
                }
                else {
                  wVar3 = L'\x01';
                }
                return wVar3;
              }
            } while( true );
          }
          sVar7 = strlen(pcVar13);
          strncat(pcVar13,pcVar8,0x1fff - sVar7);
          sVar7 = strlen(pcVar13);
          strncat(pcVar13,"\n",0x1fff - sVar7);
          snprintf(pcVar8,0x1000,"%s/test",__s);
          pcVar10 = slurpfile((size_t *)0x0,"%s/%s",pcVar8,"test_option_f.cpio.uu");
          if (pcVar10 != (char *)0x0) goto LAB_0010588b;
          sVar7 = strlen(pcVar13);
          strncat(pcVar13,pcVar8,0x1fff - sVar7);
          sVar7 = strlen(pcVar13);
          strncat(pcVar13,"\n",0x1fff - sVar7);
          snprintf(pcVar8,0x1000,"%s/%s/test",__s,"bsdcpio");
          pcVar10 = slurpfile((size_t *)0x0,"%s/%s",pcVar8,"test_option_f.cpio.uu");
          if (pcVar10 != (char *)0x0) goto LAB_0010588b;
          sVar7 = strlen(pcVar13);
          strncat(pcVar13,pcVar8,0x1fff - sVar7);
          sVar7 = strlen(pcVar13);
          strncat(pcVar13,"\n",0x1fff - sVar7);
          snprintf(pcVar8,0x1000,"%s/%s/test",__s,"cpio");
          pcVar10 = slurpfile((size_t *)0x0,"%s/%s",pcVar8,"test_option_f.cpio.uu");
          if (pcVar10 != (char *)0x0) goto LAB_0010588b;
          sVar7 = strlen(pcVar13);
          strncat(pcVar13,pcVar8,0x1fff - sVar7);
          sVar7 = strlen(pcVar13);
          strncat(pcVar13,"\n",0x1fff - sVar7);
          if (*__s == 0x6a626f2f7273752f) {
            snprintf(pcVar8,0x1000,"%s",__s + 1);
            pcVar10 = slurpfile((size_t *)0x0,"%s/%s",pcVar8,"test_option_f.cpio.uu");
            if (pcVar10 != (char *)0x0) goto LAB_0010588b;
            sVar7 = strlen(pcVar13);
            strncat(pcVar13,pcVar8,0x1fff - sVar7);
            sVar7 = strlen(pcVar13);
            strncat(pcVar13,"\n",0x1fff - sVar7);
            snprintf(pcVar8,0x1000,"%s/test",__s + 1);
            pcVar10 = slurpfile((size_t *)0x0,"%s/%s",pcVar8,"test_option_f.cpio.uu");
            if (pcVar10 != (char *)0x0) goto LAB_0010588b;
            sVar7 = strlen(pcVar13);
LAB_00105551:
            strncat(pcVar13,pcVar8,0x1fff - sVar7);
            sVar7 = strlen(pcVar13);
            strncat(pcVar13,"\n",0x1fff - sVar7);
          }
          printf("Unable to locate known reference file %s\n","test_option_f.cpio.uu");
          printf("  Checked following directories:\n%s\n",pcVar13);
          puts("Use -r option to specify full path to reference directory");
          goto LAB_00106133;
        }
        uVar27 = (int)uVar32 + 1;
        uVar32 = (ulong)uVar27;
      } while (uVar27 != 1000);
      pcVar6 = "ERROR: Unable to create temp directory %s\n";
LAB_00106124:
      pcVar20 = tmpdir;
LAB_0010612c:
      fprintf(_stderr,pcVar6,pcVar20);
      goto LAB_00106133;
    }
    pcVar6 = "ERROR: Cannot use relative path for refdir\n";
    sVar7 = 0x2b;
  }
LAB_0010614e:
  fwrite(pcVar6,sVar7,1,_stderr);
LAB_00106133:
  exit(1);
LAB_00105a9f:
  bVar35 = false;
  bVar2 = true;
LAB_00105aa4:
  if (cVar23 != '^') {
    bVar35 = bVar2;
  }
  if (bVar35) {
    iVar30 = (int)uVar32;
    uVar32 = (ulong)(iVar30 + 1);
    test_set[iVar30] = (wchar_t)lVar26;
  }
  lVar26 = lVar26 + 1;
  goto LAB_00105a1d;
}

Assistant:

int
main(int argc, char **argv)
{
	static const int limit = nitems(tests);
	int test_set[nitems(tests)];
	int i = 0, j = 0, tests_run = 0, tests_failed = 0, option;
	size_t testprogdir_len;
	size_t tmplen;
#ifdef PROGRAM
	size_t tmp2_len;
#endif
	time_t now;
	struct tm *tmptr;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm tmbuf;
#endif
	char *refdir_alloc = NULL;
	const char *progname;
	char **saved_argv;
	const char *tmp, *option_arg, *p;
#ifdef PATH_MAX
	char tmpdir[PATH_MAX];
#else
	char tmpdir[256];
#endif
	char *pwd, *testprogdir, *tmp2 = NULL, *vlevel = NULL;
	char tmpdir_timestamp[32];

	(void)argc; /* UNUSED */

	/* Get the current dir. */
#if defined(PATH_MAX) && !defined(__GLIBC__)
	pwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	pwd = getcwd(NULL, 0);
#endif
	while (pwd[strlen(pwd) - 1] == '\n')
		pwd[strlen(pwd) - 1] = '\0';

#if defined(HAVE__CrtSetReportMode) && !defined(__WATCOMC__)
	/* To stop to run the default invalid parameter handler. */
	_set_invalid_parameter_handler(invalid_parameter_handler);
	/* Disable annoying assertion message box. */
	_CrtSetReportMode(_CRT_ASSERT, 0);
#endif

	/*
	 * Name of this program, used to build root of our temp directory
	 * tree.
	 */
	progname = p = argv[0];
	testprogdir_len = strlen(progname) + 1;
	if ((testprogdir = malloc(testprogdir_len)) == NULL)
	{
		fprintf(stderr, "ERROR: Out of memory.");
		exit(1);
	}
	strncpy(testprogdir, progname, testprogdir_len);
	while (*p != '\0') {
		/* Support \ or / dir separators for Windows compat. */
		if (*p == '/' || *p == '\\')
		{
			progname = p + 1;
			i = j;
		}
		++p;
		j++;
	}
	testprogdir[i] = '\0';
#if defined(_WIN32) && !defined(__CYGWIN__)
	if (testprogdir[0] != '/' && testprogdir[0] != '\\' &&
	    !(((testprogdir[0] >= 'a' && testprogdir[0] <= 'z') ||
	       (testprogdir[0] >= 'A' && testprogdir[0] <= 'Z')) &&
		testprogdir[1] == ':' &&
		(testprogdir[2] == '/' || testprogdir[2] == '\\')))
#else
	if (testprogdir[0] != '/')
#endif
	{
		/* Fixup path for relative directories. */
		if ((testprogdir = realloc(testprogdir,
			strlen(pwd) + 1 + strlen(testprogdir) + 1)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		memmove(testprogdir + strlen(pwd) + 1, testprogdir,
		    strlen(testprogdir) + 1);
		memcpy(testprogdir, pwd, strlen(pwd));
		testprogdir[strlen(pwd)] = '/';
	}

#ifdef PROGRAM
	/* Get the target program from environment, if available. */
	testprogfile = getenv(ENVBASE);
#endif

	if (getenv("TMPDIR") != NULL)
		tmp = getenv("TMPDIR");
	else if (getenv("TMP") != NULL)
		tmp = getenv("TMP");
	else if (getenv("TEMP") != NULL)
		tmp = getenv("TEMP");
	else if (getenv("TEMPDIR") != NULL)
		tmp = getenv("TEMPDIR");
	else
		tmp = "/tmp";
	tmplen = strlen(tmp);
	while (tmplen > 0 && tmp[tmplen - 1] == '/')
		tmplen--;

	/* Allow -d to be controlled through the environment. */
	if (getenv(ENVBASE "_DEBUG") != NULL)
		dump_on_failure = 1;

	/* Allow -v to be controlled through the environment. */
	if (getenv("_VERBOSITY_LEVEL") != NULL)
	{
		vlevel = getenv("_VERBOSITY_LEVEL");
		verbosity = atoi(vlevel);
		if (verbosity < VERBOSITY_SUMMARY_ONLY || verbosity > VERBOSITY_FULL)
		{
			/* Unsupported verbosity levels are silently ignored */
			vlevel = NULL;
			verbosity = VERBOSITY_PASSFAIL;
		}
	}

	/* Get the directory holding test files from environment. */
	refdir = getenv(ENVBASE "_TEST_FILES");

	/*
	 * Parse options, without using getopt(), which isn't available
	 * on all platforms.
	 */
	++argv; /* Skip program name */
	while (*argv != NULL) {
		if (**argv != '-')
			break;
		p = *argv++;
		++p; /* Skip '-' */
		while (*p != '\0') {
			option = *p++;
			option_arg = NULL;
			/* If 'opt' takes an argument, parse that. */
			if (option == 'p' || option == 'r') {
				if (*p != '\0')
					option_arg = p;
				else if (*argv == NULL) {
					fprintf(stderr,
					    "Option -%c requires argument.\n",
					    option);
					usage(progname);
				} else
					option_arg = *argv++;
				p = ""; /* End of this option word. */
			}

			/* Now, handle the option. */
			switch (option) {
			case 'd':
				dump_on_failure = 1;
				break;
			case 'k':
				keep_temp_files = 1;
				break;
			case 'p':
#ifdef PROGRAM
				testprogfile = option_arg;
#else
				fprintf(stderr, "-p option not permitted\n");
				usage(progname);
#endif
				break;
			case 'q':
				if (!vlevel)
					verbosity--;
				break;
			case 'r':
				refdir = option_arg;
				break;
			case 's':
				fail_if_tests_skipped = 1;
				break;
			case 'u':
				until_failure++;
				break;
			case 'v':
				if (!vlevel)
					verbosity++;
				break;
			default:
				fprintf(stderr, "Unrecognized option '%c'\n",
				    option);
				usage(progname);
			}
		}
	}

	/*
	 * Sanity-check that our options make sense.
	 */
#ifdef PROGRAM
	if (testprogfile == NULL)
	{
		tmp2_len = strlen(testprogdir) + 1 + strlen(PROGRAM) + 1;
		if ((tmp2 = malloc(tmp2_len)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		strncpy(tmp2, testprogdir, tmp2_len);
		strncat(tmp2, "/", tmp2_len);
		strncat(tmp2, PROGRAM, tmp2_len);
		testprogfile = tmp2;
	}

	{
		char *testprg;
		size_t testprg_len;
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* Command.com sometimes rejects '/' separators. */
		testprg = strdup(testprogfile);
		for (i = 0; testprg[i] != '\0'; i++) {
			if (testprg[i] == '/')
				testprg[i] = '\\';
		}
		testprogfile = testprg;
#endif
		/* Quote the name that gets put into shell command lines. */
		testprg_len = strlen(testprogfile) + 3;
		testprg = malloc(testprg_len);
		strncpy(testprg, "\"", testprg_len);
		strncat(testprg, testprogfile, testprg_len);
		strncat(testprg, "\"", testprg_len);
		testprog = testprg;
	}

	/* Sanity check: reject a relative path for refdir. */
	if (refdir != NULL) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* TODO: probably use PathIsRelative() from <shlwapi.h>. */
#else
		if (refdir[0] != '/') {
			fprintf(stderr,
			    "ERROR: Cannot use relative path for refdir\n");
			exit(1);
		}
#endif
	}
#endif

#if !defined(_WIN32) && defined(SIGPIPE)
	{   /* Ignore SIGPIPE signals */
		struct sigaction sa;
		sa.sa_handler = SIG_IGN;
		sigemptyset(&sa.sa_mask);
		sa.sa_flags = 0;
		sigaction(SIGPIPE, &sa, NULL);
	}
#endif

	/*
	 * Create a temp directory for the following tests.
	 * Include the time the tests started as part of the name,
	 * to make it easier to track the results of multiple tests.
	 */
	now = time(NULL);
	for (i = 0; ; i++) {
#if defined(HAVE_LOCALTIME_S)
		tmptr = localtime_s(&tmbuf, &now) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
		tmptr = localtime_r(&now, &tmbuf);
#else
		tmptr = localtime(&now);
#endif
		strftime(tmpdir_timestamp, sizeof(tmpdir_timestamp),
		    "%Y-%m-%dT%H.%M.%S", tmptr);
		if (tmplen + 1 + strlen(progname) + 1 +
		    strlen(tmpdir_timestamp) + 1 + 3 >=
		    nitems(tmpdir)) {
			fprintf(stderr,
			    "ERROR: Temp directory pathname too long\n");
			exit(1);
		}
		snprintf(tmpdir, sizeof(tmpdir), "%.*s/%s.%s-%03d",
		    (int)tmplen, tmp, progname, tmpdir_timestamp, i);
		if (assertMakeDir(tmpdir, 0755))
			break;
		if (i >= 999) {
			fprintf(stderr,
			    "ERROR: Unable to create temp directory %s\n",
			    tmpdir);
			exit(1);
		}
	}

	/*
	 * If the user didn't specify a directory for locating
	 * reference files, try to find the reference files in
	 * the "usual places."
	 */
	refdir = refdir_alloc = get_refdir(refdir);

	/*
	 * Banner with basic information.
	 */
	printf("\n");
	printf("If tests fail or crash, details will be in:\n");
	printf("   %s\n", tmpdir);
	printf("\n");
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("Reference files will be read from: %s\n", refdir);
#ifdef PROGRAM
		printf("Running tests on: %s\n", testprog);
#endif
		printf("Exercising: ");
		fflush(stdout);
		printf("%s\n", EXTRA_VERSION);
	} else {
		printf("Running ");
		fflush(stdout);
	}

	/*
	 * Run some or all of the individual tests.
	 */
	saved_argv = argv;
	do {
		argv = saved_argv;
		do {
			int test_num;

			test_num = get_test_set(test_set, limit, *argv);
			if (test_num < 0) {
				printf("*** INVALID Test %s\n", *argv);
				free(refdir_alloc);
				free(testprogdir);
				usage(progname);
			}
			for (i = 0; i < test_num; i++) {
				tests_run++;
				if (test_run(test_set[i], tmpdir)) {
					tests_failed++;
					if (until_failure)
						goto finish;
				}
			}
			if (*argv != NULL)
				argv++;
		} while (*argv != NULL);
	} while (until_failure);

finish:
	/* Must be freed after all tests run */
	free(tmp2);
	free(testprogdir);
	free(pwd);

	/*
	 * Report summary statistics.
	 */
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("\n");
		printf("Totals:\n");
		printf("  Tests run:         %8d\n", tests_run);
		printf("  Tests failed:      %8d\n", tests_failed);
		printf("  Assertions checked:%8d\n", assertions);
		printf("  Assertions failed: %8d\n", failures);
		printf("  Skips reported:    %8d\n", skips);
	}
	if (failures) {
		printf("\n");
		printf("Failing tests:\n");
		for (i = 0; i < limit; ++i) {
			if (tests[i].failures)
				printf("  %d: %s (%d failures)\n", i,
				    tests[i].name, tests[i].failures);
		}
		printf("\n");
		printf("Details for failing tests: %s\n", tmpdir);
		printf("\n");
	} else {
		if (verbosity == VERBOSITY_SUMMARY_ONLY)
			printf("\n");
		printf("%d tests passed, no failures\n", tests_run);
	}

	free(refdir_alloc);

	/* If the final tmpdir is empty, we can remove it. */
	/* This should be the usual case when all tests succeed. */
	assertChdir("..");
	rmdir(tmpdir);

	if (tests_failed) return 1;

	if (fail_if_tests_skipped == 1 && skips > 0) return 2;

	return 0;
}